

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_cosh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  int8_t roundingPrecision;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 fVar8;
  floatx80 fVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  
  fVar8.low = a.low;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      fVar8._8_8_ = a._8_8_ & 0xffffffff;
      fVar8 = propagateFloatx80NaNOneArg(fVar8,status);
      return fVar8;
    }
    uVar6 = 0x7fff;
    uVar5 = 0;
  }
  else {
    uVar7 = a._8_4_ & 0x7fff;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && fVar8.low == 0)
    {
      uVar6 = CONCAT62((int6)((ulong)status >> 0x10),0x3fff);
      uVar5 = 0x8000000000000000;
    }
    else {
      cVar1 = status->float_rounding_mode;
      roundingPrecision = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      uVar4 = (uint)a.low._6_2_ | uVar7 << 0x10;
      if (uVar4 < 0x400cb168) {
        a_00._8_4_ = uVar7;
        a_00.low = fVar8.low;
        a_00._12_4_ = 0;
        fVar8 = floatx80_etox_m68k(a_00,status);
        fVar9 = float32_to_floatx80_m68k(0x3f000000,status);
        fVar10._8_8_ = fVar9._8_8_ & 0xffffffff;
        fVar10.low = fVar9.low;
        auVar2 = fVar8._0_12_;
        a_01._12_4_ = 0;
        a_01.low = auVar2._0_8_;
        a_01.high = auVar2._8_2_;
        a_01._10_2_ = auVar2._10_2_;
        fVar8 = floatx80_mul_m68k(a_01,fVar10,status);
        fVar10 = float32_to_floatx80_m68k(0x3e800000,status);
        auVar2 = fVar8._0_12_;
        fVar9._12_4_ = 0;
        fVar9.low = auVar2._0_8_;
        fVar9.high = auVar2._8_2_;
        fVar9._10_2_ = auVar2._10_2_;
        auVar3 = fVar10._0_12_;
        a_02._12_4_ = 0;
        a_02.low = auVar3._0_8_;
        a_02.high = auVar3._8_2_;
        a_02._10_2_ = auVar3._10_2_;
        fVar8 = floatx80_div_m68k(a_02,fVar9,status);
        b._8_8_ = fVar8._8_8_ & 0xffffffff;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        b.low = fVar8.low;
        a_03._12_4_ = 0;
        a_03.low = auVar2._0_8_;
        a_03.high = auVar2._8_2_;
        a_03._10_2_ = auVar2._10_2_;
        fVar8 = floatx80_add_m68k(a_03,b,status);
        auVar2 = fVar8._0_12_;
      }
      else {
        if (0x400cb2b3 < uVar4) {
          status->float_rounding_mode = cVar1;
          status->floatx80_rounding_precision = roundingPrecision;
          fVar8 = roundAndPackFloatx80_m68k
                            (roundingPrecision,'\0',0x8000,0x8000000000000000,0,status);
          return fVar8;
        }
        fVar10 = float64_to_floatx80_m68k(0x40c62d38d3d64634,status);
        b_00._8_8_ = fVar10._8_8_ & 0xffffffff;
        b_00.low = fVar10.low;
        a_04._8_4_ = uVar7;
        a_04.low = fVar8.low;
        a_04._12_4_ = 0;
        fVar8 = floatx80_sub_m68k(a_04,b_00,status);
        fVar10 = float64_to_floatx80_m68k(0x3d6f90aeb1e75cc7,status);
        b_01._8_8_ = fVar10._8_8_ & 0xffffffff;
        b_01.low = fVar10.low;
        auVar2 = fVar8._0_12_;
        a_05._12_4_ = 0;
        a_05.low = auVar2._0_8_;
        a_05.high = auVar2._8_2_;
        a_05._10_2_ = auVar2._10_2_;
        fVar8 = floatx80_sub_m68k(a_05,b_01,status);
        auVar2 = fVar8._0_12_;
        a_06._12_4_ = 0;
        a_06.low = auVar2._0_8_;
        a_06.high = auVar2._8_2_;
        a_06._10_2_ = auVar2._10_2_;
        fVar8 = floatx80_etox_m68k(a_06,status);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = roundingPrecision;
        b_02._8_8_ = 0x7ffb;
        b_02.low = 0x8000000000000000;
        auVar2 = fVar8._0_12_;
        a_07._12_4_ = 0;
        a_07.low = auVar2._0_8_;
        a_07.high = auVar2._8_2_;
        a_07._10_2_ = auVar2._10_2_;
        fVar8 = floatx80_mul_m68k(a_07,b_02,status);
        auVar2 = fVar8._0_12_;
      }
      uVar5 = auVar2._0_8_;
      float_raise_m68k(' ',status);
      uVar6 = (ulong)auVar2._8_4_;
    }
  }
  fVar11._8_8_ = uVar6;
  fVar11.low = uVar5;
  return fVar11;
}

Assistant:

floatx80 floatx80_cosh(floatx80 a, float_status *status)
{
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return packFloatx80(0, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(0, one_exp, one_sig);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact > 0x400CB167) {
        if (compact > 0x400CB2B3) {
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;
            return roundAndPackFloatx80(status->floatx80_rounding_precision, 0,
                                        0x8000, one_sig, 0, status);
        } else {
            fp0 = packFloatx80(0, aExp, aSig);
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x40C62D38D3D64634), status),
                               status);
            fp0 = floatx80_sub(fp0, float64_to_floatx80(
                               make_float64(0x3D6F90AEB1E75CC7), status),
                               status);
            fp0 = floatx80_etox(fp0, status);
            fp1 = packFloatx80(0, 0x7FFB, one_sig);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_mul(fp0, fp1, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    }

    fp0 = packFloatx80(0, aExp, aSig); /* |X| */
    fp0 = floatx80_etox(fp0, status); /* EXP(|X|) */
    fp0 = floatx80_mul(fp0, float32_to_floatx80(make_float32(0x3F000000),
                       status), status); /* (1/2)*EXP(|X|) */
    fp1 = float32_to_floatx80(make_float32(0x3E800000), status); /* 1/4 */
    fp1 = floatx80_div(fp1, fp0, status); /* 1/(2*EXP(|X|)) */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_add(fp0, fp1, status);

    float_raise(float_flag_inexact, status);

    return a;
}